

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniGUI.c
# Opt level: O0

void EPD_DrawBitmap(uint16_t Xpos,uint16_t Ypos,uint16_t *bmp)

{
  ushort uVar1;
  double Gray;
  uint16_t temp;
  uint16_t B;
  uint16_t G;
  uint16_t R;
  uint16_t j;
  uint16_t i;
  uint16_t *bmp_local;
  uint16_t Ypos_local;
  uint16_t Xpos_local;
  
  for (temp = 0; temp < 0x19c; temp = temp + 1) {
    for (B = 0; B < 0x226; B = B + 1) {
      uVar1 = bmp[(uint)temp * 0x226 + (uint)B];
      EPD_DrawPixel(B,temp,(uint8_t)(int)(double)(((uint)(ushort)((uVar1 & 0x1f) << 3) * 0x72 + 500
                                                  + (uint)(uVar1 >> 8 & 0xf8) * 299 +
                                                    ((uVar1 & 0x7e0) >> 3) * 0x24b) / 1000));
    }
  }
  return;
}

Assistant:

void EPD_DrawBitmap(uint16_t Xpos, uint16_t Ypos,uint16_t *bmp)
{
	uint16_t i,j;
	uint16_t R,G,B,temp;
	double Gray;

	for (j=0;j<412;j++)
	{
		for (i=0;i<550;i++)
		{
			temp = bmp[j*550+i];
			R = (temp >> 11)<<3;
			G = ((temp&0x07E0) >> 5)<<2;
			B = (temp&0x01F)<<3;
			Gray = (R*299 + G*587 + B*114 + 500) / 1000;
			EPD_DrawPixel(i, j,(uint8_t)Gray);
		}	
	}
}